

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2ParallelDecode.cpp
# Opt level: O2

error<idx2::idx2_err_code>
idx2::TraverseSecondLevel
          (idx2_file *Idx2,params *P,decode_data *D,decode_state First,extent *Extent,grid *OutGrid,
          mmap_volume *OutVolFile,volume *OutVolMem)

{
  v3<int> *pvVar1;
  u64 *puVar2;
  byte *pbVar3;
  undefined1 auVar4 [16];
  byte bVar5;
  undefined2 uVar6;
  int iVar7;
  i32 iVar8;
  anon_union_8_4_6ba14846_for_v2<int>_1 aVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  decode_state Ds;
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  byte bVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  i64 iVar23;
  byte bVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  u64 uVar31;
  int iVar32;
  uint uVar33;
  int iVar34;
  uint uVar35;
  u64 uVar36;
  ulong uVar37;
  int iVar38;
  int iVar39;
  file_traverse *pfVar40;
  uint uVar42;
  ulong uVar41;
  int iVar43;
  int iVar44;
  v3<int> *pvVar45;
  int iVar46;
  brick_traverse *Top;
  chunk_traverse *pcVar47;
  idx2_file *Idx2_00;
  byte bVar48;
  ulong *puVar49;
  long *in_FS_OFFSET;
  bool bVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  extent eVar54;
  error<idx2::idx2_err_code> eVar55;
  v3i Brick3;
  ulong local_2f60;
  ulong local_2f40;
  ulong local_2f28;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_2f08;
  char *local_2f00;
  brick_traverse First_3;
  undefined4 uStack_2e9c;
  undefined1 uStack_2e8b;
  extent local_2e68;
  extent local_2e58;
  array<idx2::decode_state> local_2e48;
  extent Skip;
  undefined8 uStack_2e08;
  undefined8 uStack_2e00;
  undefined8 uStack_2df8;
  i64 iStack_2df0;
  undefined8 uStack_2de8;
  u64 local_2de0;
  extent local_2dd8;
  idx2_file *local_2dc8;
  stack_array<idx2::v3<int>,_16> *local_2dc0;
  stack_array<idx2::v3<int>,_16> *local_2db8;
  f64 local_2db0;
  grid *local_2da8;
  mmap_volume *local_2da0;
  int local_2d98;
  int iStack_2d94;
  extent *local_2d90;
  extent CurrentExtent;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelDecode_cpp:338:3)>
  __ScopeGuard__338;
  extent local_2d68;
  extent local_2d58;
  extent Skip_1;
  extent local_2d28;
  undefined8 local_2d18;
  undefined8 uStack_2d10;
  undefined8 local_2d08;
  undefined8 uStack_2d00;
  undefined8 uStack_2cf8;
  undefined8 uStack_2cf0;
  undefined8 local_2ce8;
  undefined8 uStack_2ce0;
  undefined8 uStack_2cd8;
  undefined8 uStack_2cd0;
  int local_2cc8;
  int iStack_2cc4;
  int iStack_2cc0;
  undefined8 uStack_2cbc;
  undefined8 uStack_2cb4;
  byte bStack_2cac;
  undefined2 uStack_2cab;
  byte bStack_2ca9;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_2ca8;
  int iStack_2ca0;
  int iStack_2c9c;
  int iStack_2c98;
  int iStack_2c94;
  undefined4 uStack_2c90;
  undefined4 uStack_2c8c;
  i32 iStack_2c88;
  undefined4 uStack_2c84;
  undefined4 uStack_2c80;
  undefined4 uStack_2c7c;
  undefined8 local_2c78;
  undefined8 uStack_2c70;
  undefined8 uStack_2c68;
  undefined8 uStack_2c60;
  undefined8 local_2c58;
  undefined8 uStack_2c50;
  undefined8 uStack_2c48;
  undefined8 uStack_2c40;
  chunk_traverse First_2;
  undefined8 uStack_1c48;
  undefined4 auStack_1c40 [2];
  file_traverse First_1;
  u64 auStack_1c08 [3];
  bool local_1bf0;
  file_traverse FileStack [64];
  
  auVar51._8_8_ = 0;
  auVar51._0_8_ = P->DecodeTolerance;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = Idx2->Tolerance;
  auVar4 = vmaxsd_avx(auVar51,auVar4);
  local_2db0 = auVar4._0_8_;
  local_2da8 = OutGrid;
  local_2da0 = OutVolFile;
  Mallocator();
  Mallocator();
  __ScopeGuard__338.Func.BrickStack = &local_2e48;
  local_2e48.Buffer.Data = (byte *)0x0;
  local_2e48.Buffer.Bytes = 0;
  local_2e48.Buffer.Alloc = &Mallocator::Instance.super_allocator;
  local_2e48.Size = 0;
  local_2e48.Capacity = 0;
  local_2e48.Alloc = &Mallocator::Instance.super_allocator;
  __ScopeGuard__338.Dismissed = false;
  GrowCapacity<idx2::decode_state>(__ScopeGuard__338.Func.BrickStack,0x80);
  if (local_2e48.Capacity <= local_2e48.Size) {
    GrowCapacity<idx2::decode_state>(&local_2e48,0);
  }
  lVar27 = local_2e48.Size * 0x60;
  uVar13 = First.ParentBrick._56_8_;
  *(undefined1 (*) [32])(local_2e48.Buffer.Data + lVar27 + 0x3e) = First._62_32_;
  pbVar3 = local_2e48.Buffer.Data + lVar27 + 0x20;
  pbVar3[0] = First.ParentBrick.Vol.Type;
  pbVar3[1] = First.ParentBrick.Vol._33_1_;
  pbVar3[2] = First.ParentBrick.Vol._34_1_;
  pbVar3[3] = First.ParentBrick.Vol._35_1_;
  pbVar3[4] = First.ParentBrick.Vol._36_1_;
  pbVar3[5] = First.ParentBrick.Vol._37_1_;
  pbVar3[6] = First.ParentBrick.Vol._38_1_;
  pbVar3[7] = First.ParentBrick.Vol._39_1_;
  *(u64 *)(pbVar3 + 8) = First.ParentBrick.ExtentLocal.From;
  *(u64 *)(pbVar3 + 0x10) = First.ParentBrick.ExtentLocal.Dims;
  *(undefined8 *)(pbVar3 + 0x18) = uVar13;
  pbVar3 = local_2e48.Buffer.Data + lVar27;
  *(byte **)pbVar3 = First.ParentBrick.Vol.Buffer.Data;
  *(i64 *)(pbVar3 + 8) = First.ParentBrick.Vol.Buffer.Bytes;
  *(allocator **)(pbVar3 + 0x10) = First.ParentBrick.Vol.Buffer.Alloc;
  *(u64 *)(pbVar3 + 0x18) = First.ParentBrick.Vol.Dims;
  local_2d90 = &P->DecodeExtent;
  local_2db8 = &Idx2->ChunksPerFile3s;
  local_2dc0 = &Idx2->BricksPerChunk3s;
  local_2d98 = 1;
  iStack_2d94 = 1;
  bVar16 = 0;
  Idx2_00 = Idx2;
  local_2e48.Size = local_2e48.Size + 1;
  local_2dc8 = Idx2;
LAB_001695fa:
  do {
    if (local_2e48.Size < 1) {
LAB_0016a93c:
      std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&First_1,&D->Mutex);
      D->NTasks = D->NTasks + -1;
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&First_1);
      if (D->NTasks == 0) {
        std::condition_variable::notify_all();
      }
      if ((bVar16 & 1) != 0) {
        *(char **)(*in_FS_OFFSET + -0xb80) =
             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelDecode.cpp"
        ;
        *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x19d;
        local_2f00 = "";
        local_2f08 = (anon_union_8_4_6ba14846_for_v2<int>_1)0x0;
      }
      scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelDecode.cpp:338:3)>
      ::~scope_guard(&__ScopeGuard__338);
      eVar55._8_8_ = local_2f08;
      eVar55.Msg = local_2f00;
      return eVar55;
    }
    local_2e48.Size = local_2e48.Size + -1;
    lVar27 = local_2e48.Size * 0x60;
    pbVar3 = local_2e48.Buffer.Data + lVar27;
    local_2c78 = *(undefined8 *)pbVar3;
    uStack_2c70 = *(undefined8 *)(pbVar3 + 8);
    uStack_2c68 = *(undefined8 *)(pbVar3 + 0x10);
    uStack_2c60 = *(undefined8 *)(pbVar3 + 0x18);
    pbVar3 = local_2e48.Buffer.Data + lVar27 + 0x20;
    local_2c58 = *(undefined8 *)pbVar3;
    uStack_2c50 = *(undefined8 *)(pbVar3 + 8);
    uStack_2c48 = *(undefined8 *)(pbVar3 + 0x10);
    uStack_2c40 = *(undefined8 *)(pbVar3 + 0x18);
    iVar26 = *(int *)(local_2e48.Buffer.Data + lVar27 + 0x40);
    iVar34 = *(int *)(local_2e48.Buffer.Data + lVar27 + 0x44);
    iVar39 = *(int *)(local_2e48.Buffer.Data + lVar27 + 0x48);
    local_2d18 = *(undefined8 *)(local_2e48.Buffer.Data + lVar27 + 0x4c);
    uStack_2d10 = *(undefined8 *)(local_2e48.Buffer.Data + lVar27 + 0x4c + 8);
    uVar6 = *(undefined2 *)(local_2e48.Buffer.Data + lVar27 + 0x5d);
    bVar5 = local_2e48.Buffer.Data[lVar27 + 0x5f];
    bVar48 = (byte)*(undefined4 *)(local_2e48.Buffer.Data + lVar27 + 0x5c);
    bVar24 = bVar48;
    if ((char)bVar48 < '\x01') {
      bVar24 = 0;
    }
    uVar42 = (uint)bVar24;
    iVar32 = 1;
    iVar43 = local_2d98;
    iVar25 = iStack_2d94;
    while (bVar50 = uVar42 != 0, uVar42 = uVar42 - 1, bVar50) {
      iVar43 = (Idx2_00->GroupBrick3).field_0.field_0.X * iVar43;
      iVar25 = iVar25 * (Idx2_00->GroupBrick3).field_0.field_0.Y;
      iVar32 = iVar32 * (Idx2_00->GroupBrick3).field_0.field_0.Z;
    }
    uVar35 = (Idx2_00->BrickDims3).field_0.field_0.X * iVar43;
    uVar42 = iVar25 * (Idx2_00->BrickDims3).field_0.field_0.Y;
    uVar33 = iVar32 * (Idx2_00->BrickDims3).field_0.field_0.Z;
    local_2e58.From = 0;
    local_2e58.Dims = 0;
    local_2e68.From = 0;
    local_2e68.Dims = 0;
    local_2dd8.From = 0;
    local_2dd8.Dims = 0;
    local_2d58.From = 0;
    local_2d58.Dims = 0;
    local_2d68.From = 0;
    local_2d68.Dims = 0;
    local_2d28.From = 0;
    local_2d28.Dims = 0;
    CurrentExtent.From =
         (ulong)(uVar33 * iVar39 & 0x1fffff) << 0x2a |
         (ulong)(uVar42 * iVar34 & 0x1fffff) << 0x15 | (ulong)(uVar35 * iVar26 & 0x1fffff);
    CurrentExtent.Dims =
         (ulong)(uVar33 & 0x1fffff) << 0x2a |
         (ulong)(uVar42 & 0x1fffff) << 0x15 | (ulong)(uVar35 & 0x1fffff);
    eVar54 = Crop<idx2::extent,idx2::extent>(&CurrentExtent,local_2d90);
    uVar36 = eVar54.Dims;
    if (((long)(uVar36 << 0x16) >> 0x2b) * ((long)(uVar36 << 0x2b) >> 0x2b) *
        ((long)(uVar36 * 2) >> 0x2b) != 0) {
      local_2d08 = local_2c78;
      uStack_2d00 = uStack_2c70;
      uStack_2cf8 = uStack_2c68;
      uStack_2cf0 = uStack_2c60;
      local_2ce8 = local_2c58;
      uStack_2ce0 = uStack_2c50;
      uStack_2cd8 = uStack_2c48;
      uStack_2cd0 = uStack_2c40;
      uStack_2cbc = local_2d18;
      uStack_2cb4 = uStack_2d10;
      Ds.Brick3.field_0.field_0.Y = iVar34;
      Ds.Brick3.field_0.field_0.X = iVar26;
      Ds.Brick3.field_0.field_0.Z = iVar39;
      Ds._76_8_ = local_2d18;
      Ds._84_8_ = uStack_2d10;
      Ds.Level = bVar48;
      Ds._93_2_ = uVar6;
      Ds._95_1_ = bVar5;
      Ds.ParentBrick.Vol.Buffer.Bytes = uStack_2c70;
      Ds.ParentBrick.Vol.Buffer.Data = (byte *)local_2c78;
      Ds.ParentBrick.Vol.Buffer.Alloc = (allocator *)uStack_2c68;
      Ds.ParentBrick.Vol.Dims = uStack_2c60;
      Ds.ParentBrick.Vol._32_8_ = local_2c58;
      Ds.ParentBrick.ExtentLocal.From = uStack_2c50;
      Ds.ParentBrick.ExtentLocal.Dims = uStack_2c48;
      Ds.ParentBrick.NChildrenDecoded = (undefined1)uStack_2c40;
      Ds.ParentBrick.NChildrenMax = uStack_2c40._1_1_;
      Ds.ParentBrick.Significant = (bool)uStack_2c40._2_1_;
      Ds.ParentBrick.DoneDecoding = (bool)uStack_2c40._3_1_;
      Ds.ParentBrick._60_4_ = uStack_2c40._4_4_;
      local_2cc8 = iVar26;
      iStack_2cc4 = iVar34;
      iStack_2cc0 = iVar39;
      bStack_2cac = bVar48;
      uStack_2cab = uVar6;
      bStack_2ca9 = bVar5;
      DecodeTask((expected<idx2::brick_volume,_idx2::idx2_err_code> *)&First_1,Idx2_00,P,D,Ds,
                 *local_2da8,local_2db0,local_2da0,OutVolMem);
      bVar16 = local_1bf0;
      uVar13 = First_1.FileFrom3.field_0.field_3.XY.field_0;
      uVar36 = First_1.PrevOrder;
      local_2f00 = (char *)First_1.PrevOrder;
      local_2f08 = (anon_union_8_4_6ba14846_for_v2<int>_1)
                   First_1.FileFrom3.field_0.field_3.XY.field_0;
      local_2ca8.field_0.Y = First_1.FileTo3.field_0.field_0.X;
      local_2ca8.field_0.X = First_1.FileFrom3.field_0.field_0.Z;
      iStack_2ca0 = First_1.FileTo3.field_0.field_0.Y;
      iStack_2c9c = First_1.FileTo3.field_0.field_0.Z;
      iStack_2c98 = (int)First_1.Address;
      iStack_2c94 = (int)(First_1.Address >> 0x20);
      uStack_2c90 = (undefined4)auStack_1c08[0];
      uStack_2c8c = auStack_1c08[0]._4_4_;
      iStack_2c88 = (i32)auStack_1c08[1];
      uStack_2c84 = (undefined4)(auStack_1c08[1] >> 0x20);
      uStack_2c80 = (undefined4)auStack_1c08[2];
      uStack_2c7c = (undefined4)(auStack_1c08[2] >> 0x20);
      if ((local_1bf0 & 1U) == 0) goto LAB_0016a93c;
      bVar48 = bVar48 - 1;
      if (-1 < (char)bVar48) {
        if (0xf < bVar48) {
          __assert_fail("Idx < N",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                        ,0x20c,
                        "t &idx2::stack_array<unsigned char, 16>::operator[](int) const [t = unsigned char, N = 16]"
                       );
        }
        if ((Idx2_00->DecodeSubbandMasks).Arr[bVar48] != '\0') {
          ComputeExtentsForTraversal
                    (Idx2_00,&CurrentExtent,bVar48,&local_2e58,&local_2e68,&local_2dd8,&local_2d58,
                     &local_2d68,&local_2d28);
          lVar27 = 0x28;
          do {
            *(undefined8 *)((long)&FileStack[0].FileOrder + lVar27) = 0;
            lVar27 = lVar27 + 0x30;
          } while (lVar27 != 0xc28);
          lVar27 = (long)(Idx2->NFiles3).Arr[bVar48].field_0.field_0.X;
          uVar28 = 1;
          if (lVar27 != 0) {
            uVar37 = lVar27 - 1;
            lVar27 = 0x3f;
            if (uVar37 != 0) {
              for (; uVar37 >> lVar27 == 0; lVar27 = lVar27 + -1) {
              }
            }
            uVar28 = 1L << (-((byte)lVar27 ^ 0x3f) & 0x3f) & 0xffffffff;
            if (uVar37 == 0) {
              uVar28 = 1;
            }
          }
          lVar27 = (long)(Idx2->NFiles3).Arr[bVar48].field_0.field_0.Y;
          uVar37 = 0x100000000;
          if (lVar27 != 0) {
            uVar41 = lVar27 - 1;
            lVar27 = 0x3f;
            if (uVar41 != 0) {
              for (; uVar41 >> lVar27 == 0; lVar27 = lVar27 + -1) {
              }
            }
            uVar37 = 0x100000000 << (-((byte)lVar27 ^ 0x3f) & 0x3f);
            if (uVar41 == 0) {
              uVar37 = 0x100000000;
            }
          }
          lVar27 = (long)(Idx2->NFiles3).Arr[bVar48].field_0.field_0.Z;
          FileStack[0].FileTo3.field_0._8_4_ = 1;
          if (lVar27 != 0) {
            uVar41 = lVar27 - 1;
            lVar27 = 0x3f;
            if (uVar41 != 0) {
              for (; uVar41 >> lVar27 == 0; lVar27 = lVar27 + -1) {
              }
            }
            FileStack[0].FileTo3.field_0._8_4_ = (int)(1L << (-((byte)lVar27 ^ 0x3f) & 0x3f));
            if (uVar41 == 0) {
              FileStack[0].FileTo3.field_0._8_4_ = 1;
            }
          }
          FileStack[0].FileOrder = (Idx2_00->FilesOrder).Arr[bVar48];
          FileStack[0].PrevOrder = FileStack[0].FileOrder;
          FileStack[0].FileFrom3.field_0.field_3.XY.field_0 =
               (anon_union_8_4_6ba14846_for_v2<int>_1)0x0;
          FileStack[0].FileFrom3.field_0.field_0.Z = 0;
          FileStack[0].FileTo3.field_0.field_3.XY.field_0 = uVar37 | uVar28;
          FileStack[0].Address = 0;
          pvVar1 = local_2db8->Arr + bVar48;
          pvVar45 = local_2dc0->Arr + bVar48;
          local_2f28 = 0;
          uVar11 = First_1.FileFrom3.field_0.field_3.XY.field_0;
LAB_00169aa0:
          do {
            First_1.FileFrom3.field_0.field_3.XY.field_0 = (v2<int>)(v2<int>)uVar11;
            pfVar40 = FileStack + local_2f28;
            while( true ) {
              if ((int)local_2f28 < 0) goto LAB_001695fa;
              uVar28 = pfVar40->FileOrder;
              uVar37 = uVar28 >> 2;
              pfVar40->FileOrder = uVar37;
              uVar42 = (uint)uVar28 & 3;
              if (uVar42 != 3) break;
              if (uVar37 == 3) {
                pfVar40->FileOrder = FileStack[local_2f28].PrevOrder;
              }
              else {
                FileStack[local_2f28].PrevOrder = uVar37;
              }
            }
            uVar28 = (ulong)((int)local_2f28 - 1);
            iVar26 = FileStack[local_2f28].FileFrom3.field_0.field_0.X;
            if (((FileStack[local_2f28].FileTo3.field_0.field_0.X - iVar26 == 1) &&
                (iVar34 = FileStack[local_2f28].FileFrom3.field_0.field_0.Y,
                FileStack[local_2f28].FileTo3.field_0.field_0.Y - iVar34 == 1)) &&
               (iVar39 = FileStack[local_2f28].FileFrom3.field_0.field_0.Z,
               FileStack[local_2f28].FileTo3.field_0.field_0.Z - iVar39 == 1)) {
              lVar27 = 0x38;
              do {
                *(undefined8 *)((long)&uStack_1c48 + lVar27) = 0;
                *(undefined4 *)((long)auStack_1c40 + lVar27) = 0;
                *(undefined8 *)((long)&First_1.FileOrder + lVar27) = 0;
                lVar27 = lVar27 + 0x40;
              } while (lVar27 != 0x1038);
              iVar32 = (pvVar1->field_0).field_0.X;
              iVar25 = 1;
              iVar43 = iVar25;
              if ((long)iVar32 != 0) {
                uVar37 = (long)iVar32 - 1;
                lVar27 = 0x3f;
                if (uVar37 != 0) {
                  for (; uVar37 >> lVar27 == 0; lVar27 = lVar27 + -1) {
                  }
                }
                iVar43 = (int)(1L << (-((byte)lVar27 ^ 0x3f) & 0x3f));
                if (uVar37 == 0) {
                  iVar43 = iVar25;
                }
              }
              iVar46 = (pvVar1->field_0).field_0.Y;
              iVar44 = iVar25;
              if ((long)iVar46 != 0) {
                uVar37 = (long)iVar46 - 1;
                lVar27 = 0x3f;
                if (uVar37 != 0) {
                  for (; uVar37 >> lVar27 == 0; lVar27 = lVar27 + -1) {
                  }
                }
                iVar44 = (int)(1L << (-((byte)lVar27 ^ 0x3f) & 0x3f));
                if (uVar37 == 0) {
                  iVar44 = iVar25;
                }
              }
              iVar7 = (pvVar1->field_0).field_0.Z;
              iVar38 = iVar25;
              if ((long)iVar7 != 0) {
                uVar37 = (long)iVar7 - 1;
                lVar27 = 0x3f;
                if (uVar37 != 0) {
                  for (; uVar37 >> lVar27 == 0; lVar27 = lVar27 + -1) {
                  }
                }
                iVar38 = (int)(1L << (-((byte)lVar27 ^ 0x3f) & 0x3f));
                if (uVar37 == 0) {
                  iVar38 = iVar25;
                }
              }
              First_1.FileOrder = (Idx2_00->ChunksOrderInFile).Arr[bVar48];
              iVar32 = iVar32 * iVar26;
              iVar46 = iVar46 * iVar34;
              First_1.FileFrom3.field_0.field_0.Z = iVar7 * iVar39;
              First_1.FileFrom3.field_0.field_0.Y = iVar46;
              First_1.FileFrom3.field_0.field_0.X = iVar32;
              First_1.PrevOrder = First_1.FileOrder;
              First_1.FileTo3.field_0.field_0.X = iVar43 + iVar32;
              First_1.FileTo3.field_0.field_0.Y = iVar44 + iVar46;
              First_1.FileTo3.field_0.field_0.Z = iVar38 + First_1.FileFrom3.field_0.field_0.Z;
              First_1.Address = 0;
              auStack_1c08[0]._0_4_ = 0;
              auStack_1c08[1] = 0;
              local_2f40 = 0;
LAB_00169c5d:
              do {
                lVar27 = local_2f40 * 0x40;
                puVar49 = (ulong *)((long)&First_1 + lVar27);
                while( true ) {
                  local_2f28 = uVar28;
                  uVar11 = First_1.FileFrom3.field_0.field_3.XY.field_0;
                  if ((int)local_2f40 < 0) goto LAB_00169aa0;
                  uVar37 = *puVar49;
                  uVar41 = uVar37 >> 2;
                  *puVar49 = uVar41;
                  uVar42 = (uint)uVar37 & 3;
                  if (uVar42 != 3) break;
                  if (uVar41 == 3) {
                    *puVar49 = *(ulong *)((long)&First_1 + lVar27 + 8);
                  }
                  else {
                    *(ulong *)((long)&First_1 + lVar27 + 8) = uVar41;
                  }
                }
                uVar37 = (ulong)((int)local_2f40 - 1);
                iVar26 = *(int *)((long)&First_1 + lVar27 + 0x10);
                if (((*(int *)((long)&First_1 + lVar27 + 0x1c) - iVar26 == 1) &&
                    (iVar34 = *(int *)((long)&First_1 + lVar27 + 0x14),
                    *(int *)((long)&First_1 + lVar27 + 0x20) - iVar34 == 1)) &&
                   (iVar39 = *(int *)((long)&First_1 + lVar27 + 0x18),
                   *(int *)((long)&First_1 + lVar27 + 0x24) - iVar39 == 1)) {
                  lVar27 = 0x38;
                  do {
                    *(undefined8 *)((long)&uStack_2c48 + lVar27) = 0;
                    *(undefined4 *)((long)&uStack_2c40 + lVar27) = 0;
                    *(undefined8 *)((long)&First_2.ChunkOrder + lVar27) = 0;
                    lVar27 = lVar27 + 0x40;
                  } while (lVar27 != 0x1038);
                  iVar32 = (pvVar45->field_0).field_0.X;
                  iVar25 = 1;
                  iVar43 = iVar25;
                  if ((long)iVar32 != 0) {
                    uVar41 = (long)iVar32 - 1;
                    lVar27 = 0x3f;
                    if (uVar41 != 0) {
                      for (; uVar41 >> lVar27 == 0; lVar27 = lVar27 + -1) {
                      }
                    }
                    iVar43 = (int)(1L << (-((byte)lVar27 ^ 0x3f) & 0x3f));
                    if (uVar41 == 0) {
                      iVar43 = iVar25;
                    }
                  }
                  iVar46 = (pvVar45->field_0).field_0.Y;
                  iVar44 = iVar25;
                  if ((long)iVar46 != 0) {
                    uVar41 = (long)iVar46 - 1;
                    lVar27 = 0x3f;
                    if (uVar41 != 0) {
                      for (; uVar41 >> lVar27 == 0; lVar27 = lVar27 + -1) {
                      }
                    }
                    iVar44 = (int)(1L << (-((byte)lVar27 ^ 0x3f) & 0x3f));
                    if (uVar41 == 0) {
                      iVar44 = iVar25;
                    }
                  }
                  iVar7 = (pvVar45->field_0).field_0.Z;
                  iVar38 = iVar25;
                  if ((long)iVar7 != 0) {
                    uVar41 = (long)iVar7 - 1;
                    lVar27 = 0x3f;
                    if (uVar41 != 0) {
                      for (; uVar41 >> lVar27 == 0; lVar27 = lVar27 + -1) {
                      }
                    }
                    iVar38 = (int)(1L << (-((byte)lVar27 ^ 0x3f) & 0x3f));
                    if (uVar41 == 0) {
                      iVar38 = iVar25;
                    }
                  }
                  First_2.ChunkOrder = (Idx2_00->BricksOrderInChunk).Arr[bVar48];
                  iVar32 = iVar32 * iVar26;
                  iVar46 = iVar46 * iVar34;
                  First_2.ChunkFrom3.field_0.field_0.Z = iVar7 * iVar39;
                  First_2.ChunkFrom3.field_0.field_0.Y = iVar46;
                  First_2.ChunkFrom3.field_0.field_0.X = iVar32;
                  First_2.ChunkTo3.field_0.field_0.X = iVar43 + iVar32;
                  uVar41 = (ulong)(uint)First_2.ChunkTo3.field_0.field_0.X;
                  First_2.PrevOrder = First_2.ChunkOrder;
                  First_2.ChunkTo3.field_0.field_0.Y = iVar44 + iVar46;
                  First_2.ChunkTo3.field_0.field_0.Z = iVar38 + First_2.ChunkFrom3.field_0.field_0.Z
                  ;
                  First_2.NChunksBefore = 0;
                  First_2._48_8_ = First_2._48_8_ & 0xffffffff00000000;
                  First_2.Address = 0;
                  local_2f60 = 0;
                  do {
                    while( true ) {
                      pcVar47 = &First_2 + local_2f60;
                      while( true ) {
                        local_2f40 = uVar37;
                        if ((int)local_2f60 < 0) goto LAB_00169c5d;
                        uVar30 = pcVar47->ChunkOrder;
                        uVar29 = uVar30 >> 2;
                        pcVar47->ChunkOrder = uVar29;
                        uVar42 = (uint)uVar30 & 3;
                        if (uVar42 != 3) break;
                        if (uVar29 == 3) {
                          pcVar47->ChunkOrder = (&First_2)[local_2f60].PrevOrder;
                        }
                        else {
                          (&First_2)[local_2f60].PrevOrder = uVar29;
                        }
                      }
                      uVar30 = (ulong)((int)local_2f60 - 1);
                      auVar52._8_8_ = 0;
                      auVar52._0_8_ = (&First_2)[local_2f60].ChunkTo3.field_0.field_3.XY.field_0;
                      auVar53._8_8_ = 0;
                      auVar53._0_8_ = (&First_2)[local_2f60].ChunkFrom3.field_0.field_3.XY.field_0;
                      auVar4 = vpsubd_avx(auVar52,auVar53);
                      auVar15._8_4_ = 1;
                      auVar15._0_8_ = 0x100000001;
                      auVar15._12_4_ = 1;
                      auVar4 = vpcmpeqd_avx(auVar4,auVar15);
                      auVar4 = vpmovsxdq_avx(auVar4);
                      uVar33 = vmovmskpd_avx(auVar4);
                      if ((((uVar33 & 1) == 0) || ((byte)((byte)uVar33 >> 1) == 0)) ||
                         (uVar33 = (&First_2)[local_2f60].ChunkFrom3.field_0.field_0.Z,
                         (&First_2)[local_2f60].ChunkTo3.field_0.field_0.Z - uVar33 != 1)) break;
                      brick_volume::brick_volume((brick_volume *)&First_3);
                      iVar8 = (&First_2)[local_2f60].ChunkInFile;
                      iVar26 = (&First_2)[local_2f60].ChunkFrom3.field_0.field_0.Z;
                      aVar9 = (&First_2)[local_2f60].ChunkFrom3.field_0.field_3.XY.field_0;
                      Brick3.field_0.field_0.Y = 0;
                      Brick3.field_0.field_0.X = uVar33;
                      Brick3.field_0._8_4_ = (undefined4)uVar41;
                      uVar41 = uVar41 & 0xffffffff;
                      uVar31 = GetLinearBrick((idx2 *)Idx2_00,
                                              (idx2_file *)(ulong)(uint)(int)(char)bVar48,
                                              (int)*(undefined8 *)
                                                    &(&First_2)[local_2f60].ChunkFrom3.field_0,
                                              Brick3);
                      First_3.BrickOrder = uVar36;
                      First_3.PrevOrder = uVar13;
                      First_3.BrickInChunk = iStack_2c88;
                      First_3._52_4_ = uStack_2c84;
                      First_3.Address._0_4_ = uStack_2c80;
                      First_3.BrickFrom3.field_0.field_3.XY.field_0 = (v2<int>)(v2<int>)local_2ca8;
                      First_3.BrickFrom3.field_0.field_0.Z = iStack_2ca0;
                      First_3.BrickTo3.field_0.field_0.X = iStack_2c9c;
                      First_3.BrickTo3.field_0.field_0.Y = iStack_2c98;
                      First_3.BrickTo3.field_0.field_0.Z = iStack_2c94;
                      First_3.NBricksBefore._0_4_ = uStack_2c90;
                      First_3.NBricksBefore._4_4_ = uStack_2c8c;
                      if (local_2e48.Capacity <= local_2e48.Size) {
                        GrowCapacity<idx2::decode_state>(&local_2e48,0);
                      }
                      lVar27 = local_2e48.Size * 0x60;
                      auVar14._2_8_ = aVar9;
                      auVar14._0_2_ = First_3.Address._6_2_;
                      auVar14._10_4_ = iVar26;
                      auVar14._14_4_ = uStack_2e9c;
                      auVar14._18_8_ = uVar31;
                      auVar14._26_4_ = iVar8;
                      auVar14[0x1e] = bVar48;
                      auVar14[0x1f] = uStack_2e8b;
                      *(undefined1 (*) [32])(local_2e48.Buffer.Data + lVar27 + 0x3e) = auVar14;
                      pbVar3 = local_2e48.Buffer.Data + lVar27 + 0x20;
                      *(ulong *)pbVar3 =
                           CONCAT44(First_3.BrickTo3.field_0.field_0.Z,
                                    First_3.BrickTo3.field_0.field_0.Y);
                      *(ulong *)(pbVar3 + 8) =
                           CONCAT44(First_3.NBricksBefore._4_4_,(undefined4)First_3.NBricksBefore);
                      *(ulong *)(pbVar3 + 0x10) = CONCAT44(First_3._52_4_,First_3.BrickInChunk);
                      *(ulong *)(pbVar3 + 0x18) =
                           CONCAT26(First_3.Address._6_2_,
                                    CONCAT24(First_3.Address._4_2_,(undefined4)First_3.Address));
                      puVar2 = (u64 *)(local_2e48.Buffer.Data + lVar27);
                      *puVar2 = First_3.BrickOrder;
                      puVar2[1] = First_3.PrevOrder;
                      ((v2<int> *)(puVar2 + 2))->field_0 =
                           (anon_union_8_4_6ba14846_for_v2<int>_1)
                           First_3.BrickFrom3.field_0.field_3.XY.field_0;
                      puVar2[3] = CONCAT44(First_3.BrickTo3.field_0.field_0.X,
                                           First_3.BrickFrom3.field_0.field_0.Z);
                      local_2f60 = uVar30;
                      local_2e48.Size = local_2e48.Size + 1;
LAB_0016a339:
                    }
                    First_3.BrickOrder = pcVar47->ChunkOrder;
                    First_3.PrevOrder = (&First_2)[local_2f60].PrevOrder;
                    uVar41 = *(ulong *)&(&First_2)[local_2f60].ChunkFrom3.field_0;
                    uVar11 = *(undefined8 *)((long)&(&First_2)[local_2f60].ChunkFrom3.field_0 + 8);
                    uVar10 = *(undefined8 *)((long)&(&First_2)[local_2f60].ChunkTo3.field_0 + 4);
                    uVar31 = (&First_2)[local_2f60].Address;
                    First_3.BrickTo3.field_0.field_0.Y = (int)uVar10;
                    First_3.BrickTo3.field_0.field_0.Z = (int)((ulong)uVar10 >> 0x20);
                    First_3.NBricksBefore._0_4_ = (undefined4)(&First_2)[local_2f60].NChunksBefore;
                    First_3.NBricksBefore._4_4_ =
                         (undefined4)((ulong)(&First_2)[local_2f60].NChunksBefore >> 0x20);
                    First_3.BrickInChunk = (i32)*(undefined8 *)&(&First_2)[local_2f60].ChunkInFile;
                    First_3._52_4_ =
                         SUB84((ulong)*(undefined8 *)&(&First_2)[local_2f60].ChunkInFile >> 0x20,0);
                    First_3.Address._0_4_ = (undefined4)uVar31;
                    First_3.Address._4_2_ = (undefined2)(uVar31 >> 0x20);
                    First_3.Address._6_2_ = (undefined2)(uVar31 >> 0x30);
                    First_3.BrickFrom3.field_0.field_0.Z = (int)uVar11;
                    uVar19 = First_3.BrickFrom3.field_0.field_0.Z;
                    First_3.BrickTo3.field_0.field_0.X = (int)((ulong)uVar11 >> 0x20);
                    Skip.From = pcVar47->ChunkOrder;
                    Skip.Dims = (&First_2)[local_2f60].PrevOrder;
                    uStack_2e08 = *(undefined8 *)&(&First_2)[local_2f60].ChunkFrom3.field_0;
                    uStack_2e00 = *(undefined8 *)
                                   ((long)&(&First_2)[local_2f60].ChunkFrom3.field_0.field_4.YZ.
                                           field_0 + 4);
                    uStack_2df8 = *(undefined8 *)
                                   ((long)&(&First_2)[local_2f60].ChunkTo3.field_0.field_3.XY.
                                           field_0 + 4);
                    iStack_2df0 = (&First_2)[local_2f60].NChunksBefore;
                    uStack_2de8 = *(undefined8 *)&(&First_2)[local_2f60].ChunkInFile;
                    uVar29 = (ulong)(uVar42 << 2);
                    iVar26 = *(int *)((long)&(&First_2)[local_2f60].ChunkFrom3.field_0 + uVar29);
                    iVar26 = (*(int *)((long)&(&First_2)[local_2f60].ChunkTo3.field_0 + uVar29) -
                             iVar26) / 2 + iVar26;
                    *(int *)((long)&First_3.BrickTo3.field_0 + uVar29) = iVar26;
                    uVar22 = First_3.BrickTo3.field_0.field_0.Z;
                    uVar21 = First_3.BrickTo3.field_0.field_0.Y;
                    uVar20 = First_3.BrickTo3.field_0.field_0.X;
                    *(int *)((long)&uStack_2e08 + uVar29) = iVar26;
                    First_3.BrickFrom3.field_0.field_0.X = (int)uVar41;
                    uVar17 = First_3.BrickFrom3.field_0.field_0.X;
                    First_3.BrickFrom3.field_0.field_0.Y = (int)(uVar41 >> 0x20);
                    uVar18 = First_3.BrickFrom3.field_0.field_0.Y;
                    uVar35 = First_3.BrickTo3.field_0.field_0.X - First_3.BrickFrom3.field_0._0_4_;
                    uVar42 = First_3.BrickTo3.field_0.field_0.Y - First_3.BrickFrom3.field_0._4_4_;
                    uVar33 = First_3.BrickTo3.field_0.field_0.Z - First_3.BrickFrom3.field_0._8_4_;
                    Skip_1.From = (ulong)(First_3.BrickFrom3.field_0.field_0.Z & 0x1fffff) << 0x2a |
                                  ((ulong)(uint)First_3.BrickFrom3.field_0.field_0.Y & 0x1fffff) <<
                                  0x15 | uVar41 & 0x1fffff;
                    Skip_1.Dims = (ulong)(uVar33 & 0x1fffff) << 0x2a |
                                  (ulong)(uVar42 & 0x1fffff) << 0x15 | (ulong)(uVar35 & 0x1fffff);
                    lVar27 = CONCAT44(First_3.NBricksBefore._4_4_,(undefined4)First_3.NBricksBefore)
                    ;
                    First_3.BrickFrom3.field_0._0_8_ = uVar41;
                    eVar54 = Crop<idx2::extent,idx2::extent>(&Skip_1,&local_2e58);
                    iVar8 = First_3.BrickInChunk;
                    uVar31 = eVar54.Dims;
                    iStack_2df0 = ((long)(uVar31 << 0x16) >> 0x2b) *
                                  ((long)(uVar31 << 0x2b) >> 0x2b) * ((long)(uVar31 * 2) >> 0x2b) +
                                  lVar27;
                    eVar54 = Crop<idx2::extent,idx2::extent>(&Skip_1,&local_2d58);
                    uStack_2de8 = CONCAT44(uStack_2de8._4_4_,
                                           (((int)eVar54.Dims << 0xb) >> 0xb) *
                                           (int)((long)(eVar54.Dims * 2) >> 0x2b) *
                                           (int)((long)(eVar54.Dims << 0x16) >> 0x2b) + iVar8);
                    uVar31 = (&First_2)[local_2f60].Address;
                    First_3.Address._0_4_ = (undefined4)uVar31;
                    First_3.Address._4_2_ = (undefined2)(uVar31 >> 0x20);
                    First_3.Address._6_2_ = (undefined2)(uVar31 >> 0x30);
                    local_2de0 = (long)(int)uVar33 * (long)(int)uVar42 * (long)(int)uVar35 + uVar31;
                    uVar41 = ((long)(local_2e58.Dims << 0x16) >> 0xb) +
                             ((long)(local_2e58.From << 0x16) >> 0xb & 0xffffffff00000000U);
                    iVar39 = (int)((long)(local_2e58.From << 0x2b) >> 0x2b);
                    iVar32 = (((int)local_2e58.Dims << 0xb) >> 0xb) + iVar39;
                    iVar26 = (int)((long)(local_2e58.From * 2) >> 0x2b);
                    iVar43 = (int)((long)(local_2e58.Dims * 2) >> 0x2b) + iVar26;
                    iVar25 = (int)(uVar41 >> 0x20);
                    iVar34 = (int)((long)(local_2e58.From << 0x16) >> 0x2b);
                    if ((((((int)uStack_2e08 < iVar32) && (uStack_2e08._4_4_ < iVar25)) &&
                         ((int)uStack_2e00 < iVar43)) &&
                        ((iVar39 < uStack_2e00._4_4_ && (iVar34 < (int)uStack_2df8)))) &&
                       (iVar26 < uStack_2df8._4_4_)) {
                      *(undefined8 *)((long)&(&First_2)[local_2f60].ChunkTo3.field_0 + 4) =
                           uStack_2df8;
                      (&First_2)[local_2f60].NChunksBefore = iStack_2df0;
                      *(undefined8 *)&(&First_2)[local_2f60].ChunkInFile = uStack_2de8;
                      (&First_2)[local_2f60].Address = local_2de0;
                      pcVar47->ChunkOrder = Skip.From;
                      (&First_2)[local_2f60].PrevOrder = Skip.Dims;
                      *(undefined8 *)&(&First_2)[local_2f60].ChunkFrom3.field_0 = uStack_2e08;
                      *(undefined8 *)((long)&(&First_2)[local_2f60].ChunkFrom3.field_0 + 8) =
                           uStack_2e00;
                      uVar30 = local_2f60;
                    }
                    local_2f60 = uVar30;
                    if (((iVar32 <= (int)uVar17) || (uVar41 = uVar41 >> 0x20, iVar25 <= (int)uVar18)
                        ) || ((iVar43 <= (int)uVar19 ||
                              (((int)uVar20 <= iVar39 ||
                               ((int)uVar22 <= iVar26 || (int)uVar21 <= iVar34))))))
                    goto LAB_0016a339;
                    local_2f60 = (ulong)((int)local_2f60 + 1);
                    *(ulong *)((long)&(&First_2)[local_2f60].ChunkTo3.field_0.field_3.XY.field_0 + 4
                              ) = CONCAT44(First_3.BrickTo3.field_0.field_0.Z,
                                           First_3.BrickTo3.field_0.field_0.Y);
                    (&First_2)[local_2f60].NChunksBefore =
                         CONCAT44(First_3.NBricksBefore._4_4_,(undefined4)First_3.NBricksBefore);
                    *(ulong *)&(&First_2)[local_2f60].ChunkInFile =
                         CONCAT44(First_3._52_4_,First_3.BrickInChunk);
                    (&First_2)[local_2f60].Address = uVar31;
                    (&First_2)[local_2f60].ChunkOrder = First_3.BrickOrder;
                    (&First_2)[local_2f60].PrevOrder = First_3.PrevOrder;
                    (&First_2)[local_2f60].ChunkFrom3.field_0.field_3.XY.field_0 =
                         (anon_union_8_4_6ba14846_for_v2<int>_1)
                         First_3.BrickFrom3.field_0.field_3.XY.field_0;
                    *(ulong *)((long)&(&First_2)[local_2f60].ChunkFrom3.field_0.field_4.YZ.field_0 +
                              4) = CONCAT44(First_3.BrickTo3.field_0.field_0.X,
                                            First_3.BrickFrom3.field_0.field_0.Z);
                  } while( true );
                }
                uVar11 = *(undefined8 *)((long)&First_1 + lVar27 + 0x18);
                uVar10 = *(undefined8 *)((long)&First_1 + lVar27 + 0x20);
                First_2.ChunkTo3.field_0.field_0.Y = (int)uVar10;
                First_2.ChunkTo3.field_0.field_0.Z = (int)((ulong)uVar10 >> 0x20);
                First_2.NChunksBefore = *(i64 *)((long)&First_1 + lVar27 + 0x28);
                First_2._48_8_ = auStack_1c08[local_2f40 * 8];
                First_2.Address = auStack_1c08[local_2f40 * 8 + 1];
                First_2.ChunkOrder = *puVar49;
                First_2.PrevOrder = *(u64 *)((long)&First_1 + lVar27 + 8);
                First_2.ChunkFrom3.field_0.field_3.XY.field_0 =
                     (v2<int>)(v2<int>)*(anon_union_8_4_6ba14846_for_v2<int>_1 *)
                                        ((long)&First_1 + lVar27 + 0x10);
                First_2.ChunkFrom3.field_0.field_0.Z = (int)uVar11;
                First_2.ChunkTo3.field_0.field_0.X = (int)((ulong)uVar11 >> 0x20);
                First_3.BrickOrder = *puVar49;
                First_3.PrevOrder = *(u64 *)((long)&First_1 + lVar27 + 8);
                First_3.BrickFrom3.field_0.field_3.XY.field_0 =
                     (v2<int>)*(anon_union_8_4_6ba14846_for_v2<int>_1 *)
                               ((long)&First_1 + lVar27 + 0x10);
                uVar11 = *(undefined8 *)((long)&First_1 + lVar27 + 0x18);
                uVar10 = *(undefined8 *)((long)&First_1 + lVar27 + 0x20);
                uVar12 = *(undefined8 *)((long)&First_1 + lVar27 + 0x28);
                First_3.BrickTo3.field_0.field_0.Y = (int)uVar10;
                First_3.BrickTo3.field_0.field_0.Z = (int)((ulong)uVar10 >> 0x20);
                First_3.NBricksBefore._0_4_ = (undefined4)uVar12;
                First_3.NBricksBefore._4_4_ = (undefined4)((ulong)uVar12 >> 0x20);
                First_3.BrickInChunk = (i32)auStack_1c08[local_2f40 * 8];
                First_3._52_4_ = SUB84(auStack_1c08[local_2f40 * 8] >> 0x20,0);
                First_3.BrickFrom3.field_0.field_0.Z = (int)uVar11;
                First_3.BrickTo3.field_0.field_0.X = (int)((ulong)uVar11 >> 0x20);
                uVar41 = (ulong)(uVar42 << 2);
                iVar26 = *(int *)((long)&First_1 + uVar41 + lVar27 + 0x10);
                iVar26 = (*(int *)((long)&First_1 + uVar41 + lVar27 + 0x1c) - iVar26) / 2 + iVar26;
                *(int *)((long)&First_2.ChunkTo3.field_0 + uVar41) = iVar26;
                *(int *)((long)&First_3.BrickFrom3.field_0 + uVar41) = iVar26;
                iVar23 = First_2.NChunksBefore;
                uVar22 = First_2.ChunkTo3.field_0.field_0.Z;
                uVar21 = First_2.ChunkTo3.field_0.field_0.Y;
                uVar20 = First_2.ChunkTo3.field_0.field_0.X;
                uVar19 = First_2.ChunkFrom3.field_0.field_0.Z;
                uVar17 = First_2.ChunkFrom3.field_0.field_0.X;
                uVar18 = First_2.ChunkFrom3.field_0.field_0.Y;
                uVar33 = First_2.ChunkTo3.field_0.field_0.X - First_2.ChunkFrom3.field_0._0_4_;
                uVar42 = First_2.ChunkTo3.field_0.field_0.Y - First_2.ChunkFrom3.field_0._4_4_;
                uVar35 = First_2.ChunkTo3.field_0.field_0.Z - First_2.ChunkFrom3.field_0._8_4_;
                Skip.From = (ulong)(First_2.ChunkFrom3.field_0.field_0.Z & 0x1fffff) << 0x2a |
                            ((ulong)(uint)First_2.ChunkFrom3.field_0.field_0.Y & 0x1fffff) << 0x15 |
                            (ulong)First_2.ChunkFrom3.field_0.field_3.XY.field_0 & 0x1fffff;
                Skip.Dims = (ulong)(uVar35 & 0x1fffff) << 0x2a |
                            (ulong)(uVar42 & 0x1fffff) << 0x15 | (ulong)(uVar33 & 0x1fffff);
                eVar54 = Crop<idx2::extent,idx2::extent>(&Skip,&local_2e68);
                uVar31 = eVar54.Dims;
                First_3.NBricksBefore =
                     ((long)(uVar31 << 0x16) >> 0x2b) * ((long)(uVar31 << 0x2b) >> 0x2b) *
                     ((long)(uVar31 * 2) >> 0x2b) + iVar23;
                iVar8 = First_2.ChunkInFile;
                eVar54 = Crop<idx2::extent,idx2::extent>(&Skip,&local_2d68);
                First_3.BrickInChunk =
                     (((int)eVar54.Dims << 0xb) >> 0xb) * (int)((long)(eVar54.Dims * 2) >> 0x2b) *
                     (int)((long)(eVar54.Dims << 0x16) >> 0x2b) + iVar8;
                First_2.Address = auStack_1c08[local_2f40 * 8 + 1];
                uVar31 = (long)(int)uVar35 * (long)(int)uVar42 * (long)(int)uVar33 + First_2.Address
                ;
                First_3.Address._0_4_ = (undefined4)uVar31;
                First_3.Address._4_2_ = (undefined2)(uVar31 >> 0x20);
                First_3.Address._6_2_ = (undefined2)(uVar31 >> 0x30);
                iVar39 = (int)((long)(local_2e68.From << 0x2b) >> 0x2b);
                iVar32 = (((int)local_2e68.Dims << 0xb) >> 0xb) + iVar39;
                iVar26 = (int)((long)(local_2e68.From * 2) >> 0x2b);
                iVar43 = (int)((long)(local_2e68.Dims * 2) >> 0x2b) + iVar26;
                iVar25 = (int)(((long)(local_2e68.Dims << 0x16) >> 0xb) +
                               ((long)(local_2e68.From << 0x16) >> 0xb & 0xffffffff00000000U) >>
                              0x20);
                iVar34 = (int)((long)(local_2e68.From << 0x16) >> 0x2b);
                if ((((First_3.BrickFrom3.field_0.field_0.X < iVar32) &&
                     (First_3.BrickFrom3.field_0.field_0.Y < iVar25)) &&
                    (First_3.BrickFrom3.field_0.field_0.Z < iVar43)) &&
                   (((iVar39 < First_3.BrickTo3.field_0.field_0.X &&
                     (iVar34 < First_3.BrickTo3.field_0.field_0.Y)) &&
                    (iVar26 < First_3.BrickTo3.field_0.field_0.Z)))) {
                  *(ulong *)((long)&First_1 + lVar27 + 0x20) =
                       CONCAT44(First_3.BrickTo3.field_0.field_0.Z,
                                First_3.BrickTo3.field_0.field_0.Y);
                  *(i64 *)((long)&First_1 + lVar27 + 0x28) = First_3.NBricksBefore;
                  auStack_1c08[local_2f40 * 8] = CONCAT44(First_3._52_4_,First_3.BrickInChunk);
                  auStack_1c08[local_2f40 * 8 + 1] = uVar31;
                  *puVar49 = First_3.BrickOrder;
                  *(u64 *)((long)&First_1 + lVar27 + 8) = First_3.PrevOrder;
                  ((v2<int> *)((long)&First_1 + lVar27 + 0x10))->field_0 =
                       (anon_union_8_4_6ba14846_for_v2<int>_1)
                       First_3.BrickFrom3.field_0.field_3.XY.field_0;
                  *(ulong *)((long)&First_1 + lVar27 + 0x18) =
                       CONCAT44(First_3.BrickTo3.field_0.field_0.X,
                                First_3.BrickFrom3.field_0.field_0.Z);
                  uVar37 = local_2f40;
                }
                local_2f40 = uVar37;
                Idx2_00 = local_2dc8;
                if ((((int)uVar17 < iVar32) && ((int)uVar18 < iVar25)) &&
                   (((int)uVar19 < iVar43 &&
                    ((iVar39 < (int)uVar20 && (iVar26 < (int)uVar22 && iVar34 < (int)uVar21)))))) {
                  local_2f40 = (ulong)((int)local_2f40 + 1);
                  lVar27 = local_2f40 * 0x40;
                  *(ulong *)((long)&First_1 + lVar27 + 0x20) =
                       CONCAT44(First_2.ChunkTo3.field_0.field_0.Z,
                                First_2.ChunkTo3.field_0.field_0.Y);
                  *(i64 *)((long)&First_1 + lVar27 + 0x28) = First_2.NChunksBefore;
                  auStack_1c08[local_2f40 * 8] = First_2._48_8_;
                  auStack_1c08[local_2f40 * 8 + 1] = First_2.Address;
                  *(u64 *)((long)&First_1 + lVar27) = First_2.ChunkOrder;
                  *(u64 *)((long)&First_1 + lVar27 + 8) = First_2.PrevOrder;
                  ((v2<int> *)((long)&First_1 + lVar27 + 0x10))->field_0 =
                       (anon_union_8_4_6ba14846_for_v2<int>_1)
                       First_2.ChunkFrom3.field_0.field_3.XY.field_0;
                  *(ulong *)((long)&First_1 + lVar27 + 0x18) =
                       CONCAT44(First_2.ChunkTo3.field_0.field_0.X,
                                First_2.ChunkFrom3.field_0.field_0.Z);
                }
              } while( true );
            }
            First_1.FileFrom3.field_0.field_3.XY.field_0 =
                 (v2<int>)*(undefined8 *)&FileStack[local_2f28].FileFrom3.field_0;
            uVar10 = *(undefined8 *)((long)&FileStack[local_2f28].FileFrom3.field_0 + 8);
            uVar11 = *(undefined8 *)((long)&FileStack[local_2f28].FileTo3.field_0 + 4);
            First_1.FileTo3.field_0.field_0.Y = (int)uVar11;
            First_1.FileTo3.field_0.field_0.Z = (int)((ulong)uVar11 >> 0x20);
            First_1.Address = FileStack[local_2f28].Address;
            First_1.FileOrder = pfVar40->FileOrder;
            First_1.PrevOrder = FileStack[local_2f28].PrevOrder;
            uVar11 = First_1.FileFrom3.field_0.field_3.XY.field_0;
            First_1.FileFrom3.field_0.field_0.Z = (int)uVar10;
            First_1.FileTo3.field_0.field_0.X = (int)((ulong)uVar10 >> 0x20);
            uVar10 = *(undefined8 *)((long)&FileStack[local_2f28].FileTo3.field_0 + 4);
            First_2.ChunkTo3.field_0.field_0.Y = (int)uVar10;
            First_2.ChunkTo3.field_0.field_0.Z = (int)((ulong)uVar10 >> 0x20);
            First_2.ChunkOrder = pfVar40->FileOrder;
            First_2.PrevOrder = FileStack[local_2f28].PrevOrder;
            uVar10 = *(undefined8 *)((long)&FileStack[local_2f28].FileFrom3.field_0 + 8);
            First_2.ChunkFrom3.field_0.field_3.XY.field_0 =
                 (v2<int>)(v2<int>)FileStack[local_2f28].FileFrom3.field_0.field_3.XY.field_0;
            First_2.ChunkFrom3.field_0.field_0.Z = (int)uVar10;
            First_2.ChunkTo3.field_0.field_0.X = (int)((ulong)uVar10 >> 0x20);
            uVar37 = (ulong)(uVar42 << 2);
            iVar26 = *(int *)((long)&FileStack[local_2f28].FileFrom3.field_0 + uVar37);
            iVar26 = (*(int *)((long)&FileStack[local_2f28].FileTo3.field_0 + uVar37) - iVar26) / 2
                     + iVar26;
            *(int *)((long)&First_1.FileTo3.field_0 + uVar37) = iVar26;
            *(int *)((long)&First_2.ChunkFrom3.field_0 + uVar37) = iVar26;
            First_1.Address = FileStack[local_2f28].Address;
            First_2.NChunksBefore =
                 (long)(First_1.FileTo3.field_0.field_0.Z - First_1.FileFrom3.field_0._8_4_) *
                 (long)(First_1.FileTo3.field_0.field_0.Y - First_1.FileFrom3.field_0._4_4_) *
                 (long)(First_1.FileTo3.field_0.field_0.X - First_1.FileFrom3.field_0._0_4_) +
                 First_1.Address;
            iVar43 = (int)((long)(local_2dd8.From << 0x2b) >> 0x2b);
            iVar25 = (((int)local_2dd8.Dims << 0xb) >> 0xb) + iVar43;
            iVar32 = (int)((long)(local_2dd8.From * 2) >> 0x2b);
            iVar39 = (int)((long)(local_2dd8.Dims * 2) >> 0x2b) + iVar32;
            iVar26 = (int)(((long)(local_2dd8.Dims << 0x16) >> 0xb) +
                           ((long)(local_2dd8.From << 0x16) >> 0xb & 0xffffffff00000000U) >> 0x20);
            iVar34 = (int)((long)(local_2dd8.From << 0x16) >> 0x2b);
            if ((((First_2.ChunkFrom3.field_0.field_0.X < iVar25) &&
                 (First_2.ChunkFrom3.field_0.field_0.Y < iVar26)) &&
                (First_2.ChunkFrom3.field_0.field_0.Z < iVar39)) &&
               (((iVar43 < First_2.ChunkTo3.field_0.field_0.X &&
                 (iVar34 < First_2.ChunkTo3.field_0.field_0.Y)) &&
                (iVar32 < First_2.ChunkTo3.field_0.field_0.Z)))) {
              FileStack[local_2f28].FileFrom3.field_0.field_3.XY.field_0 =
                   (anon_union_8_4_6ba14846_for_v2<int>_1)
                   First_2.ChunkFrom3.field_0.field_3.XY.field_0;
              *(ulong *)((long)&FileStack[local_2f28].FileFrom3.field_0.field_4.YZ.field_0 + 4) =
                   CONCAT44(First_2.ChunkTo3.field_0.field_0.X,First_2.ChunkFrom3.field_0.field_0.Z)
              ;
              *(ulong *)((long)&FileStack[local_2f28].FileTo3.field_0.field_3.XY.field_0 + 4) =
                   CONCAT44(First_2.ChunkTo3.field_0.field_0.Z,First_2.ChunkTo3.field_0.field_0.Y);
              FileStack[local_2f28].Address = First_2.NChunksBefore;
              pfVar40->FileOrder = First_2.ChunkOrder;
              FileStack[local_2f28].PrevOrder = First_2.PrevOrder;
              FileStack[local_2f28].FileFrom3.field_0.field_3.XY.field_0 =
                   (anon_union_8_4_6ba14846_for_v2<int>_1)
                   First_2.ChunkFrom3.field_0.field_3.XY.field_0;
              *(ulong *)((long)&FileStack[local_2f28].FileFrom3.field_0.field_4.YZ.field_0 + 4) =
                   CONCAT44(First_2.ChunkTo3.field_0.field_0.X,First_2.ChunkFrom3.field_0.field_0.Z)
              ;
              uVar28 = local_2f28;
            }
            local_2f28 = uVar28;
            if (((First_1.FileFrom3.field_0.field_0.X < iVar25) &&
                (First_1.FileFrom3.field_0.field_0.Y < iVar26)) &&
               ((First_1.FileFrom3.field_0.field_0.Z < iVar39 &&
                ((iVar43 < First_1.FileTo3.field_0.field_0.X &&
                 (iVar32 < First_1.FileTo3.field_0.field_0.Z &&
                  iVar34 < First_1.FileTo3.field_0.field_0.Y)))))) {
              local_2f28 = (ulong)((int)local_2f28 + 1);
              *(undefined8 *)&FileStack[local_2f28].FileFrom3.field_0 =
                   First_1.FileFrom3.field_0.field_3.XY.field_0;
              *(ulong *)((long)&FileStack[local_2f28].FileFrom3.field_0.field_4.YZ.field_0 + 4) =
                   CONCAT44(First_1.FileTo3.field_0.field_0.X,First_1.FileFrom3.field_0.field_0.Z);
              *(ulong *)((long)&FileStack[local_2f28].FileTo3.field_0.field_3.XY.field_0 + 4) =
                   CONCAT44(First_1.FileTo3.field_0.field_0.Z,First_1.FileTo3.field_0.field_0.Y);
              FileStack[local_2f28].Address = First_1.Address;
              FileStack[local_2f28].FileOrder = First_1.FileOrder;
              FileStack[local_2f28].PrevOrder = First_1.PrevOrder;
              *(undefined8 *)&FileStack[local_2f28].FileFrom3.field_0 =
                   First_1.FileFrom3.field_0.field_3.XY.field_0;
              *(ulong *)((long)&FileStack[local_2f28].FileFrom3.field_0.field_4.YZ.field_0 + 4) =
                   CONCAT44(First_1.FileTo3.field_0.field_0.X,First_1.FileFrom3.field_0.field_0.Z);
            }
          } while( true );
        }
      }
    }
  } while( true );
}

Assistant:

error<idx2_err_code>
TraverseSecondLevel(const idx2_file& Idx2,
                    const params& P,
                    decode_data* D,
                    decode_state First,
                    const extent& Extent,
                    const grid& OutGrid,
                    mmap_volume* OutVolFile,
                    volume* OutVolMem)
{
  // then decode the subtree
  f64 Tolerance = Max(Idx2.Tolerance, P.DecodeTolerance);
  int LastIndex = 0;
  idx2_RAII(array<decode_state>, BrickStack, Reserve(&BrickStack, 128), Dealloc(&BrickStack));
  PushBack(&BrickStack, First);
  expected<brick_volume, idx2_err_code> Result;
  while (Size(BrickStack) > 0)
  {
    decode_state Current = Back(BrickStack);
    //printf("level %d current " idx2_PrStrV3i "\n", Current.Level, idx2_PrV3i(Current.Brick3));
    PopBack(&BrickStack);
    i8 NextLevel = Current.Level - 1;
    // TODO: check for error
    v3i B3 = Idx2.BrickDims3 * Pow(Idx2.GroupBrick3, Current.Level);
    extent ExtentInBricks, ExtentInChunks, ExtentInFiles;
    extent VolExtentInBricks, VolExtentInChunks, VolExtentInFiles;
    extent CurrentExtent = extent(Current.Brick3 * B3, B3);
    extent CurrentExtentCrop = Crop(CurrentExtent, P.DecodeExtent);
    //printf("  extent     " idx2_PrStrExt "\n", idx2_PrExt(CurrentExtent));
    //printf("  extent crop" idx2_PrStrExt "\n", idx2_PrExt(CurrentExtentCrop));
    if (Prod<i64>(Dims(CurrentExtentCrop)) == 0)
      continue;
    Result = DecodeTask(Idx2, P, D, Current, OutGrid, Tolerance, OutVolFile, OutVolMem);
    if (!Result)
      goto EXIT;

    if (NextLevel < 0 || Idx2.DecodeSubbandMasks[NextLevel] == 0)
      continue;

    ComputeExtentsForTraversal(Idx2,
                               CurrentExtent,
                               NextLevel,
                               &ExtentInBricks,
                               &ExtentInChunks,
                               &ExtentInFiles,
                               &VolExtentInBricks,
                               &VolExtentInChunks,
                               &VolExtentInFiles);
    idx2_FileTraverse(
      idx2_ChunkTraverse(
        idx2_BrickTraverse(
          decode_state Ds;
          Ds.BrickInChunk = Top.BrickInChunk;
          Ds.Level = NextLevel;
          Ds.Brick3 = Top.BrickFrom3;
          Ds.Brick = GetLinearBrick(Idx2, NextLevel, Top.BrickFrom3);
          Ds.ParentBrick = Value(Result);
          PushBack(&BrickStack, Ds);
          ,
          64,
          Idx2.BricksOrderInChunk[NextLevel],
          ChunkTop.ChunkFrom3 * Idx2.BricksPerChunk3s[NextLevel],
          Idx2.BricksPerChunk3s[NextLevel],
          ExtentInBricks,
          VolExtentInBricks);
        ,
        64,
        Idx2.ChunksOrderInFile[NextLevel],
        FileTop.FileFrom3 * Idx2.ChunksPerFile3s[NextLevel],
        Idx2.ChunksPerFile3s[NextLevel],
        ExtentInChunks,
        VolExtentInChunks);
      , 64, Idx2.FilesOrder[NextLevel], v3i(0), Idx2.NFiles3[NextLevel], ExtentInFiles, VolExtentInFiles);


  }

  EXIT:
  {
    std::unique_lock<std::mutex> Lock(D->Mutex);
    --D->NTasks;
  }
  if (D->NTasks == 0)
    D->AllTasksDone.notify_all();

  if (!Result)
    return Error(Result);

  return idx2_Error(idx2_err_code::NoError);
}


error<idx2_err_code>
TraverseFirstLevel(const idx2_file& Idx2,
                   const params& P,
                   decode_data* D,
                   const grid& OutGrid,
                   mmap_volume* OutVolFile,
                   volume* OutVolMem)
{
  i8 Level = Idx2.NLevels - 1; // coarsest level
  extent ExtentInBricks, ExtentInChunks, ExtentInFiles;
  extent VolExtentInBricks, VolExtentInChunks, VolExtentInFiles;
  ComputeExtentsForTraversal(Idx2,
                             P.DecodeExtent,
                             Level,
                             &ExtentInBricks,
                             &ExtentInChunks,
                             &ExtentInFiles,
                             &VolExtentInBricks,
                             &VolExtentInChunks,
                             &VolExtentInFiles);
  v3i B3 = Idx2.BrickDims3 * Pow(Idx2.GroupBrick3, Level); // dimension of bricks on this level
  decode_state Ds;
  idx2_FileTraverse(
    idx2_ChunkTraverse(
      idx2_BrickTraverse(
        extent BrickExtent = extent(Top.BrickFrom3 * B3, B3);
        extent BrickExtentCrop = Crop(BrickExtent, P.DecodeExtent);
        {
          std::unique_lock<std::mutex> Lock(D->Mutex);
          ++D->NTasks;
        }
        decode_state First;
        First.BrickInChunk = Top.BrickInChunk;
        First.Level = Level;
        First.Brick3 = Top.BrickFrom3;
        First.Brick = GetLinearBrick(Idx2, Level, Top.BrickFrom3);
        D->ThreadPool.push_task([&, First, BrickExtentCrop]() {
          TraverseSecondLevel(Idx2, P, D, First, BrickExtentCrop, OutGrid, OutVolFile, OutVolMem);
        });
        //auto Task = stlab::async(stlab::default_executor,
        //  [&, First, BrickExtentCrop]()
        //  {
        //    TraverseSecondLevel(Idx2, P, D, First, BrickExtentCrop, OutGrid, OutVolFile, OutVolMem);
        //  });
        //Task.detach();
        ,
        64,
        Idx2.BricksOrderInChunk[Level],
        ChunkTop.ChunkFrom3 * Idx2.BricksPerChunk3s[Level],
        Idx2.BricksPerChunk3s[Level],
        ExtentInBricks,
        VolExtentInBricks);
      ,
      64,
      Idx2.ChunksOrderInFile[Level],
      FileTop.FileFrom3 * Idx2.ChunksPerFile3s[Level],
      Idx2.ChunksPerFile3s[Level],
      ExtentInChunks,
      VolExtentInChunks);
    , 64, Idx2.FilesOrder[Level], v3i(0), Idx2.NFiles3[Level], ExtentInFiles, VolExtentInFiles);

  return idx2_Error(idx2_err_code::NoError);
}


/* TODO: dealloc chunks after we are done with them */
error<idx2_err_code>
ParallelDecode(const idx2_file& Idx2, const params& P, buffer* OutBuf)
{
  timer DecodeTimer;
  StartTimer(&DecodeTimer);
  // TODO: we should add a --effective-mask
  grid OutGrid = GetGrid(Idx2, P.DecodeExtent);
  // printf("output grid = " idx2_PrStrGrid "\n", idx2_PrGrid(OutGrid));
  mmap_volume OutVolFile;
  volume OutVolMem;
  idx2_CleanUp(if (P.OutMode == params::out_mode::RegularGridFile) { Unmap(&OutVolFile); });

  if (P.OutMode == params::out_mode::RegularGridFile)
  {
    metadata Met;
    memcpy(Met.Name, Idx2.Name, sizeof(Met.Name));
    memcpy(Met.Field, Idx2.Field, sizeof(Met.Field));
    Met.Dims3 = Dims(OutGrid);
    Met.DType = Idx2.DType;
    //  printf("zfp decode time = %f\n", DecodeTime_);
    cstr OutFile = P.OutFile
                     ? idx2_PrintScratch("%s/%s", P.OutDir, P.OutFile)
                     : idx2_PrintScratch(
                         "%s/%s-tolerance-%f.raw", P.OutDir, ToRawFileName(Met), P.DecodeTolerance);
    //    idx2_RAII(mmap_volume, OutVol, (void)OutVol, Unmap(&OutVol));
    MapVolume(OutFile, Met.Dims3, Met.DType, &OutVolFile, map_mode::Write);
    printf("writing output volume to %s\n", OutFile);
  }
  else if (P.OutMode == params::out_mode::RegularGridMem)
  {
    OutVolMem.Buffer = *OutBuf;
    SetDims(&OutVolMem, Dims(OutGrid));
    OutVolMem.Type = Idx2.DType;
  }

  const int BrickBytes = Prod(Idx2.BrickDimsExt3) * sizeof(f64);
  // for now the allocator seems not a bottleneck
  idx2_RAII(decode_data, D, Init(&D, &Idx2, &Mallocator()));

  TraverseFirstLevel(Idx2, P, &D, OutGrid, &OutVolFile, &OutVolMem);

  std::unique_lock<std::mutex> Lock(D.Mutex);
  D.AllTasksDone.wait(Lock, [&D]{ return D.NTasks == 0; });
  //stlab::pre_exit();

  if (P.OutMode == params::out_mode::HashMap)
  {
    PrintStatistics(&D.BrickPool);
    ComputeBrickResolution(&D.BrickPool);
    WriteBricks(&D.BrickPool, "bricks");
  }

  printf("total decode time   = %f\n", Seconds(ElapsedTime(&DecodeTimer)));
  printf("io time             = %f\n", Seconds(D.DecodeIOTime_.load()));
  printf("data movement time  = %f\n", Seconds(D.DataMovementTime_.load()));
  printf("exp   bytes read    = %" PRIi64 "\n", D.BytesExps_.load());
  printf("data  bytes read    = %" PRIi64 "\n", D.BytesData_.load());
  printf("total bytes read    = %" PRIi64 "\n", D.BytesExps_.load() + D.BytesData_.load());
  printf("total bytes decoded = %" PRIi64 "\n", D.BytesDecoded_.load() / 8);
  printf("final size of brick hashmap = %" PRIi64 "\n", Size(D.BrickPool.BrickTable));
  printf("number of significant blocks = %" PRIi64 "\n", D.NSignificantBlocks.load());
  printf("number of insignificant subbands = %" PRIi64 "\n", D.NInsignificantSubbands.load());

  return idx2_Error(err_code::NoError);
}


}